

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O1

void Gia_ManMinCex(Gia_Man_t *p,Abc_Cex_t *pCex)

{
  lit *begin;
  sat_solver *psVar1;
  int iVar2;
  int iVar3;
  Abc_Cex_t *p_00;
  Vec_Int_t *pVVar4;
  int *piVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int level;
  int iVar10;
  long lVar11;
  bool bVar12;
  timespec ts;
  int iLit;
  timespec local_68;
  Vec_Int_t *local_58;
  sat_solver *local_50;
  lit local_44;
  Cnf_Dat_t *local_40;
  Gia_Man_t *local_38;
  
  clock_gettime(3,&local_68);
  iVar2 = clock_gettime(3,&local_68);
  if (iVar2 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  p_00 = Bmc_CexCareMinimizeAig(p,p->vCis->nSize - p->nRegs,pCex,1,1,1);
  uVar6 = p_00->nRegs;
  uVar8 = 0;
  if ((int)uVar6 < p_00->nBits) {
    uVar8 = 0;
    do {
      uVar8 = uVar8 + (((uint)(&p_00[1].iPo)[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0);
      uVar6 = uVar6 + 1;
    } while (p_00->nBits != uVar6);
  }
  Abc_CexFree(p_00);
  printf("Care bits = %d. ",(ulong)uVar8);
  iVar3 = 3;
  iVar2 = clock_gettime(3,&local_68);
  if (iVar2 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
  }
  Abc_Print(iVar3,"%s =","CEX minimization");
  Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar11 + lVar7) / 1000000.0);
  iVar2 = clock_gettime(3,&local_68);
  if (iVar2 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  local_38 = Gia_ManFramesForCexMin(p,pCex->iFrame + 1);
  local_40 = (Cnf_Dat_t *)Mf_ManGenerateCnf(local_38,8,0,0,0,0);
  iVar2 = local_40->nVars;
  iVar10 = ~pCex->iFrame * pCex->nPis;
  local_50 = (sat_solver *)Cnf_DataWriteIntoSolver(local_40,1,0);
  local_44 = 3;
  iVar3 = sat_solver_addclause(local_50,&local_44,(lit *)&local_40);
  if (iVar3 != 0) {
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nCap = 100;
    pVVar4->nSize = 0;
    piVar5 = (int *)malloc(400);
    pVVar4->pArray = piVar5;
    uVar6 = pCex->nRegs;
    local_58 = pVVar4;
    if ((int)uVar6 < pCex->nBits) {
      iVar3 = (iVar2 + uVar6 + iVar10) * 2;
      do {
        if ((int)((uVar6 + iVar10 + iVar2) - pCex->nRegs) < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        Vec_IntPush(local_58,iVar3 + (uint)(((uint)(&pCex[1].iPo)[(int)uVar6 >> 5] >> (uVar6 & 0x1f)
                                            & 1) != 0) + pCex->nRegs * -2 ^ 1);
        uVar6 = uVar6 + 1;
        iVar3 = iVar3 + 2;
      } while ((int)uVar6 < pCex->nBits);
    }
    iVar3 = 3;
    iVar2 = clock_gettime(3,&local_68);
    if (iVar2 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
    }
    Abc_Print(iVar3,"%s =","SAT solver");
    Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar11 + lVar7) / 1000000.0);
    iVar2 = 0;
    do {
      pVVar4 = local_58;
      if ((iVar2 != 0) && (uVar6 = local_58->nSize, 1 < (int)uVar6)) {
        piVar5 = local_58->pArray;
        uVar8 = uVar6 >> 1;
        uVar9 = 0;
        do {
          uVar6 = uVar6 - 1;
          iVar3 = piVar5[uVar9];
          piVar5[uVar9] = piVar5[(int)uVar6];
          piVar5[(int)uVar6] = iVar3;
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
      iVar3 = clock_gettime(3,&local_68);
      psVar1 = local_50;
      if (iVar3 < 0) {
        lVar7 = 1;
      }
      else {
        lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
        lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_68.tv_sec * -1000000;
      }
      begin = pVVar4->pArray;
      iVar3 = pVVar4->nSize;
      uVar6 = sat_solver_solve(local_50,begin,begin + iVar3,0,0,0,0);
      printf("Status %d.  Selected %d assumptions out of %d.  ",(ulong)uVar6,
             (ulong)(uint)(psVar1->conf_final).size);
      level = 3;
      iVar10 = clock_gettime(3,&local_68);
      if (iVar10 < 0) {
        lVar11 = -1;
      }
      else {
        lVar11 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
      }
      Abc_Print(level,"%s =","Analyze_final");
      Abc_Print(level,"%9.2f sec\n",(double)(lVar11 + lVar7) / 1000000.0);
      iVar10 = clock_gettime(3,&local_68);
      if (iVar10 < 0) {
        lVar7 = 1;
      }
      else {
        lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
        lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_68.tv_sec * -1000000;
      }
      uVar8 = sat_solver_minimize_assumptions(local_50,begin,iVar3,0);
      printf("Status %d.  Selected %d assumptions out of %d.  ",(ulong)uVar6,(ulong)uVar8);
      iVar10 = 3;
      iVar3 = clock_gettime(3,&local_68);
      if (iVar3 < 0) {
        lVar11 = -1;
      }
      else {
        lVar11 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
      }
      Abc_Print(iVar10,"%s =","LEXUNSAT");
      Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar11 + lVar7) / 1000000.0);
      pVVar4 = local_58;
      bVar12 = iVar2 == 0;
      iVar2 = iVar2 + 1;
    } while (bVar12);
    if (local_58->pArray != (int *)0x0) {
      free(local_58->pArray);
      pVVar4->pArray = (int *)0x0;
    }
    free(pVVar4);
    sat_solver_delete(local_50);
    Cnf_DataFree(local_40);
    Gia_ManStop(local_38);
    return;
  }
  __assert_fail("status",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCex.c"
                ,0x1d6,"void Gia_ManMinCex(Gia_Man_t *, Abc_Cex_t *)");
}

Assistant:

void Gia_ManMinCex( Gia_Man_t * p, Abc_Cex_t * pCex )
{
    abctime clk = Abc_Clock();
    int n, i, iFirstVar, iLit, status, Counter = 0;//, Id;
    Vec_Int_t * vLits;
    sat_solver * pSat;
    Cnf_Dat_t * pCnf;
    int nFinal, * pFinal;
    Abc_Cex_t * pCexCare;
    Gia_Man_t * pFrames;

    // CEX minimization
    clk = Abc_Clock();
    pCexCare = Bmc_CexCareMinimizeAig( p, Gia_ManPiNum(p), pCex, 1, 1, 1 );
    for ( i = pCexCare->nRegs; i < pCexCare->nBits; i++ )
        Counter += Abc_InfoHasBit(pCexCare->pData, i);
    Abc_CexFree( pCexCare );
    printf( "Care bits = %d. ", Counter );
    Abc_PrintTime( 1, "CEX minimization", Abc_Clock() - clk );

    // SAT instance
    clk = Abc_Clock();
    pFrames = Gia_ManFramesForCexMin( p, pCex->iFrame + 1 );
    pCnf = (Cnf_Dat_t*)Mf_ManGenerateCnf( pFrames, 8, 0, 0, 0, 0 );
    iFirstVar = pCnf->nVars - (pCex->iFrame+1) * pCex->nPis;
    pSat = (sat_solver*)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    iLit = Abc_Var2Lit( 1, 1 );
    status = sat_solver_addclause( pSat, &iLit, &iLit + 1 );
    assert( status );
    // create literals
    vLits = Vec_IntAlloc( 100 );
    for ( i = pCex->nRegs; i < pCex->nBits; i++ )
        Vec_IntPush( vLits, Abc_Var2Lit(iFirstVar + i - pCex->nRegs, !Abc_InfoHasBit(pCex->pData, i)) );
    Abc_PrintTime( 1, "SAT solver", Abc_Clock() - clk );

    for ( n = 0; n < 2; n++ )
    {
        if ( n ) Vec_IntReverseOrder( vLits );

        // SAT-based minimization
        clk = Abc_Clock();
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), 0, 0, 0, 0 );
        nFinal = sat_solver_final( pSat, &pFinal );
        printf( "Status %d.  Selected %d assumptions out of %d.  ", status, nFinal, Vec_IntSize(vLits) );
        Abc_PrintTime( 1, "Analyze_final", Abc_Clock() - clk );

        // SAT-based minimization
        clk = Abc_Clock();
        nFinal = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vLits), Vec_IntSize(vLits), 0 );
        printf( "Status %d.  Selected %d assumptions out of %d.  ", status, nFinal, Vec_IntSize(vLits) );
        Abc_PrintTime( 1, "LEXUNSAT", Abc_Clock() - clk );
    }

    // cleanup
    Vec_IntFree( vLits );
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Gia_ManStop( pFrames );
}